

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

char * lyd_path(lyd_node *node,LYD_PATH_TYPE pathtype,char *buffer,size_t buflen)

{
  lysc_node *plVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  LY_ERR LVar5;
  lys_module *plVar6;
  lys_module *plVar7;
  size_t sVar8;
  uint uVar9;
  ly_ht **pplVar10;
  char *pcVar11;
  ly_bool is_static;
  lys_module *plVar12;
  ly_ctx *ctx;
  lyd_node_inner *plVar13;
  char *pcVar14;
  long lVar15;
  ulong size;
  lyd_node_inner *node_00;
  bool bVar16;
  size_t bufused;
  char *local_60;
  size_t local_58;
  size_t local_50;
  LYD_PATH_TYPE local_44;
  lyd_node_inner *local_40;
  char *local_38;
  
  local_50 = 0;
  local_60 = buffer;
  local_58 = buflen;
  local_44 = pathtype;
  if (node == (lyd_node *)0x0) {
    pcVar14 = "node";
    ctx = (ly_ctx *)0x0;
LAB_001230e0:
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar14,"lyd_path");
    buffer = (char *)0x0;
  }
  else {
    if (buffer == (char *)0x0) {
      local_58 = 0;
      is_static = '\0';
    }
    else {
      is_static = '\x01';
      if (buflen < 2) {
        if (node->schema == (lysc_node *)0x0) {
          plVar6 = (lys_module *)&node[2].schema;
        }
        else {
          plVar6 = node->schema->module;
        }
        ctx = plVar6->ctx;
        pcVar14 = "buflen > 1";
        goto LAB_001230e0;
      }
    }
    if (pathtype < 2) {
      uVar3 = 0;
      plVar13 = (lyd_node_inner *)node;
      do {
        node_00 = plVar13;
        uVar3 = uVar3 + 1;
        plVar13 = *(lyd_node_inner **)((long)&node_00->field_0 + 0x10);
        local_40 = (lyd_node_inner *)node;
        local_38 = buffer;
      } while (*(lyd_node_inner **)((long)&node_00->field_0 + 0x10) != (lyd_node_inner *)0x0);
      do {
        uVar9 = uVar3;
        plVar6 = lyd_node_module((lyd_node *)node_00);
        if (node_00 == (lyd_node_inner *)0x0) {
          plVar13 = (lyd_node_inner *)0x0;
        }
        else {
          plVar13 = (node_00->field_0).node.parent;
        }
        plVar7 = lyd_node_module((lyd_node *)plVar13);
        plVar12 = (lys_module *)0x0;
        if (plVar7 != plVar6) {
          plVar12 = plVar6;
        }
        if (plVar12 == (lys_module *)0x0) {
          lVar15 = 2;
        }
        else {
          sVar8 = strlen(plVar12->name);
          lVar15 = sVar8 + 3;
        }
        plVar1 = (node_00->field_0).node.schema;
        pplVar10 = (ly_ht **)&plVar1->name;
        if (plVar1 == (lysc_node *)0x0) {
          pplVar10 = &node_00->children_ht;
        }
        sVar8 = strlen((char *)*pplVar10);
        sVar2 = local_50;
        size = lVar15 + local_50 + sVar8;
        if (local_58 < size) {
          if (local_38 != (char *)0x0) {
            return local_60;
          }
          local_60 = (char *)ly_realloc(local_60,size);
          local_58 = size;
          if (local_60 == (char *)0x0) {
            return (char *)0x0;
          }
        }
        pcVar14 = "";
        pcVar11 = "";
        if (plVar12 != (lys_module *)0x0) {
          pcVar14 = plVar12->name;
          pcVar11 = ":";
        }
        bVar16 = local_44 == LYD_PATH_STD;
        plVar1 = (node_00->field_0).node.schema;
        pplVar10 = (ly_ht **)&plVar1->name;
        if (plVar1 == (lysc_node *)0x0) {
          pplVar10 = &node_00->children_ht;
        }
        iVar4 = sprintf(local_60 + sVar2,"/%s%s%s",pcVar14,pcVar11,*pplVar10);
        local_50 = (long)iVar4 + sVar2;
        plVar1 = (node_00->field_0).node.schema;
        if ((plVar1 != (lysc_node *)0x0) && (bVar16 || 1 < uVar9)) {
          if (plVar1->nodetype == 8) {
            if ((plVar1->flags & 1) == 0) {
LAB_00123041:
              LVar5 = lyd_path_position_predicate
                                ((lyd_node *)node_00,&local_60,&local_58,&local_50,is_static);
            }
            else {
              LVar5 = lyd_path_leaflist_predicate
                                ((lyd_node *)node_00,&local_60,&local_58,&local_50,is_static);
            }
          }
          else {
            if (plVar1->nodetype != 0x10) goto LAB_0012307f;
            if ((plVar1->flags & 0x200) != 0) goto LAB_00123041;
            LVar5 = lyd_path_list_predicate
                              ((lyd_node *)node_00,&local_60,&local_58,&local_50,is_static);
          }
          if (LVar5 != LY_SUCCESS) {
            return local_60;
          }
        }
LAB_0012307f:
        uVar3 = uVar9 - 1;
        node_00 = local_40;
        if (uVar9 != 2) {
          if (uVar9 == 1) {
            return local_60;
          }
          uVar9 = 1;
          do {
            if (node_00 == (lyd_node_inner *)0x0) {
              node_00 = (lyd_node_inner *)0x0;
            }
            else {
              node_00 = (node_00->field_0).node.parent;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar3);
        }
      } while( true );
    }
  }
  return buffer;
}

Assistant:

LIBYANG_API_DEF char *
lyd_path(const struct lyd_node *node, LYD_PATH_TYPE pathtype, char *buffer, size_t buflen)
{
    ly_bool is_static = 0;
    uint32_t i, depth;
    size_t bufused = 0, len;
    const struct lyd_node *iter, *parent;
    const struct lys_module *mod, *prev_mod;
    LY_ERR rc = LY_SUCCESS;

    LY_CHECK_ARG_RET(NULL, node, NULL);
    if (buffer) {
        LY_CHECK_ARG_RET(LYD_CTX(node), buflen > 1, NULL);
        is_static = 1;
    } else {
        buflen = 0;
    }

    switch (pathtype) {
    case LYD_PATH_STD:
    case LYD_PATH_STD_NO_LAST_PRED:
        depth = 1;
        for (iter = node; iter->parent; iter = lyd_parent(iter)) {
            ++depth;
        }

        goto iter_print;
        while (depth) {
            /* find the right node */
            for (iter = node, i = 1; i < depth; iter = lyd_parent(iter), ++i) {}
iter_print:
            /* get the module */
            mod = lyd_node_module(iter);
            parent = lyd_parent(iter);
            prev_mod = lyd_node_module(parent);
            if (prev_mod == mod) {
                mod = NULL;
            }

            /* realloc string */
            len = 1 + (mod ? strlen(mod->name) + 1 : 0) + (iter->schema ? strlen(iter->schema->name) :
                    strlen(((struct lyd_node_opaq *)iter)->name.name));
            rc = lyd_path_str_enlarge(&buffer, &buflen, bufused + len, is_static);
            if (rc != LY_SUCCESS) {
                break;
            }

            /* print next node */
            bufused += sprintf(buffer + bufused, "/%s%s%s", mod ? mod->name : "", mod ? ":" : "", LYD_NAME(iter));

            /* do not always print the last (first) predicate */
            if (iter->schema && ((depth > 1) || (pathtype == LYD_PATH_STD))) {
                switch (iter->schema->nodetype) {
                case LYS_LIST:
                    if (iter->schema->flags & LYS_KEYLESS) {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    } else {
                        /* print all list keys in predicates */
                        rc = lyd_path_list_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    }
                    break;
                case LYS_LEAFLIST:
                    if (iter->schema->flags & LYS_CONFIG_W) {
                        /* print leaf-list value */
                        rc = lyd_path_leaflist_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    } else {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    }
                    break;
                default:
                    /* nothing to print more */
                    break;
                }
            }
            if (rc != LY_SUCCESS) {
                break;
            }

            --depth;
        }
        break;
    }

    return buffer;
}